

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O3

uint64_t highwayhash::(anonymous_namespace)::RunHighway<1u>(void *param_1,size_t size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  HHResult64 result;
  HHStateT<1U> state;
  char in [1024];
  undefined8 local_4a8;
  uint auStack_4a0 [6];
  HHStatePortable local_488;
  char local_408 [1024];
  
  local_408[0] = (char)size;
  lVar10 = 0;
  do {
    uVar1 = *(undefined4 *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10);
    uVar2 = *(undefined4 *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10 + 4);
    uVar3 = *(undefined4 *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10 + 8);
    *(undefined4 *)((long)auStack_4a0 + lVar10 + -8) = uVar2;
    *(undefined4 *)((long)auStack_4a0 + lVar10 + -4) = uVar1;
    *(undefined4 *)((long)auStack_4a0 + lVar10) = uVar2;
    *(undefined4 *)((long)auStack_4a0 + lVar10 + 4) = uVar3;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  local_488.mul0[2] = 0x13198a2e03707344;
  local_488.mul0[3] = 0x243f6a8885a308d3;
  local_488.mul0[0] = 0xdbe6d5d5fe4cce2f;
  local_488.mul0[1] = 0xa4093822299f31d0;
  local_488.mul1[0] = 0x3bd39e10cb0ef593;
  local_488.mul1[1] = 0xc0acf169b5f18a8c;
  local_488.mul1[2] = 0xbe5466cf34e90c6c;
  local_488.mul1[3] = 0x452821e638d01377;
  lVar10 = 0;
  do {
    uVar4 = *(uint *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10 + 4);
    uVar5 = *(uint *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10 + 8);
    uVar6 = *(uint *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10 + 0xc);
    uVar7 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar10 + 4);
    uVar8 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar10 + 8);
    uVar9 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar10 + 0xc);
    *(uint *)((long)local_488.v0 + lVar10) =
         *(uint *)((long)anon_unknown_5::RunHighway<1U>::key + lVar10) ^
         *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar10);
    *(uint *)((long)local_488.v0 + lVar10 + 4) = uVar4 ^ uVar7;
    *(uint *)((long)local_488.v0 + lVar10 + 8) = uVar5 ^ uVar8;
    *(uint *)((long)local_488.v0 + lVar10 + 0xc) = uVar6 ^ uVar9;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  lVar10 = 0;
  do {
    uVar4 = *(uint *)((long)auStack_4a0 + lVar10 + -4);
    uVar5 = *(uint *)((long)auStack_4a0 + lVar10);
    uVar6 = *(uint *)((long)auStack_4a0 + lVar10 + 4);
    uVar7 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar10 + 4);
    uVar8 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar10 + 8);
    uVar9 = *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar10 + 0xc);
    *(uint *)((long)local_488.v1 + lVar10) =
         *(uint *)((long)auStack_4a0 + lVar10 + -8) ^
         *(uint *)(Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar10);
    *(uint *)((long)local_488.v1 + lVar10 + 4) = uVar4 ^ uVar7;
    *(uint *)((long)local_488.v1 + lVar10 + 8) = uVar5 ^ uVar8;
    *(uint *)((long)local_488.v1 + lVar10 + 0xc) = uVar6 ^ uVar9;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x20);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
            (&local_488,local_408,size,&local_4a8);
  return local_4a8;
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}